

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

double Utils::CubicNorm(Matrix *m)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  int local_2c;
  double dStack_28;
  int j;
  double sum;
  double dStack_18;
  int i;
  double norm;
  Matrix *m_local;
  
  dStack_18 = 0.0;
  sum._4_4_ = 0;
  norm = (double)m;
  while( true ) {
    iVar2 = sum._4_4_;
    iVar1 = Matrix::GetRows((Matrix *)norm);
    if (iVar1 <= iVar2) break;
    dStack_28 = 0.0;
    local_2c = 0;
    while( true ) {
      iVar2 = Matrix::GetCols((Matrix *)norm);
      if (iVar2 <= local_2c) break;
      dVar4 = norm;
      Matrix::operator()((Matrix *)norm,sum._4_4_,local_2c);
      std::abs(SUB84(dVar4,0));
      dStack_28 = extraout_XMM0_Qa + dStack_28;
      local_2c = local_2c + 1;
    }
    pdVar3 = std::max<double>(&stack0xffffffffffffffe8,&stack0xffffffffffffffd8);
    dStack_18 = *pdVar3;
    sum._4_4_ = sum._4_4_ + 1;
  }
  return dStack_18;
}

Assistant:

double Utils::CubicNorm(const Matrix& m)
{
    double norm = 0;
    for (int i = 0; i < m.GetRows(); ++i)
    {
        double sum = 0;
        for (int j = 0; j < m.GetCols(); ++j)
        {
            sum += std::abs(m(i, j));
        }
        norm = std::max(norm, sum);
    }
    return norm;
}